

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wire.cpp
# Opt level: O3

void __thiscall tiles::Wire::setDirection(Wire *this,Chunk *chunk,uint tileIndex,t direction)

{
  TileData TVar1;
  uint uVar2;
  t tVar3;
  
  Chunk::markTileDirty(chunk,tileIndex);
  TVar1 = chunk->tiles_[tileIndex];
  uVar2 = (uint)TVar1 & 0x1f;
  if (uVar2 == 5) {
    if ((direction & east) == north) {
      return;
    }
    TVar1 = (TileData)
            (((uint)TVar1 & 0xfffff0e5 | (uint)TVar1 >> 2 & 0x300) + ((uint)TVar1 & 0x300) * 4);
  }
  else {
    if (uVar2 == 4) {
      return;
    }
    if (uVar2 == 1) {
      tVar3 = direction & east;
      uVar2 = (uint)TVar1 & 0xffffcfe1;
    }
    else {
      tVar3 = direction & west;
      uVar2 = (uint)TVar1 & 0xffffcfff;
    }
    TVar1 = (TileData)(uVar2 | (uint)tVar3 << 0xc);
  }
  chunk->tiles_[tileIndex] = TVar1;
  return;
}

Assistant:

void Wire::setDirection(Chunk& chunk, unsigned int tileIndex, Direction::t direction) {
    auto& tileData = modifyTileData(chunk, tileIndex);
    if (tileData.id == TileId::wireStraight) {
        tileData.dir = static_cast<Direction::t>(direction % 2);
    } else if (tileData.id == TileId::wireJunction) {
    } else if (tileData.id != TileId::wireCrossover) {
        tileData.dir = direction;
    } else if (direction % 2 == 1) {
        // When a crossover wire rotates an odd number of times, the two states just flip.
        auto tempState = tileData.state1;
        tileData.state1 = tileData.state2;
        tileData.state2 = tempState;
    }
}